

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O1

void capnp::_::anon_unknown_0::verifyClient(Client *client,int *callCount,WaitScope *waitScope)

{
  int iVar1;
  WirePointer *pWVar2;
  undefined8 uVar3;
  Disposer *pDVar4;
  long *plVar5;
  RequestHook *pRVar6;
  SegmentBuilder *pSVar7;
  PromiseNode *pPVar8;
  void *pvVar9;
  SegmentBuilder *pSVar10;
  PromiseNode *pPVar11;
  void *pvVar12;
  undefined4 uVar13;
  int iVar14;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  Reader RVar15;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_f8;
  Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> local_c0;
  void *local_a8;
  short local_9c;
  undefined4 local_98;
  undefined8 *local_90;
  long *local_88;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_80;
  ArrayPtr<const_char> local_48;
  Maybe<capnp::MessageSize> local_38;
  
  iVar1 = *callCount;
  local_38.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest(&local_80,client,&local_38);
  *(undefined4 *)local_80.super_Builder._builder.data = 0x7b;
  *(byte *)((long)local_80.super_Builder._builder.data + 4) =
       *(byte *)((long)local_80.super_Builder._builder.data + 4) | 1;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send(&local_f8,(int)&local_80,__buf,in_RCX,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            (&local_c0,&local_f8);
  pDVar4 = local_f8.hook.disposer;
  uVar3 = local_f8.super_Builder._builder._32_8_;
  if (local_f8.super_Builder._builder._32_8_ != 0) {
    local_f8.super_Builder._builder.dataSize = 0;
    local_f8.super_Builder._builder.pointerCount = 0;
    local_f8.super_Builder._builder._38_2_ = 0;
    local_f8.hook.disposer = (Disposer *)0x0;
    (**(local_f8.hook.ptr)->_vptr_RequestHook)(local_f8.hook.ptr,uVar3,8,pDVar4,pDVar4,0);
  }
  pWVar2 = local_f8.super_Builder._builder.pointers;
  if (local_f8.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_f8.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_f8.super_Builder._builder.data)
              (local_f8.super_Builder._builder.data,
               (long)&(pWVar2->offsetAndKind).value + *(long *)((long)*pWVar2 + -0x10));
  }
  if (local_f8.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_f8.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_f8.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena)
              ();
  }
  local_f8.super_Builder._builder.capTable = (CapTableBuilder *)local_c0.super_PromiseBase.node.ptr;
  local_f8.super_Builder._builder.data = local_a8;
  local_f8.super_Builder._builder.segment =
       (SegmentBuilder *)local_c0.super_PromiseBase.node.disposer;
  uVar13 = local_98;
  if (local_9c == 0) {
    local_f8.super_Builder._builder.capTable = (CapTableBuilder *)(PromiseNode *)0x0;
    local_f8.super_Builder._builder.data = (void *)0x0;
    local_f8.super_Builder._builder.segment = (SegmentBuilder *)0x0;
    uVar13 = 0x7fffffff;
  }
  local_f8.super_Builder._builder.pointers =
       (WirePointer *)CONCAT44(local_f8.super_Builder._builder.pointers._4_4_,uVar13);
  RVar15 = PointerReader::getBlob<capnp::Text>((PointerReader *)&local_f8,(void *)0x0,0);
  pSVar7 = local_f8.super_Builder._builder.segment;
  pPVar8 = (PromiseNode *)local_f8.super_Builder._builder.capTable;
  pvVar9 = local_f8.super_Builder._builder.data;
  pSVar10 = (SegmentBuilder *)local_c0.super_PromiseBase.node.disposer;
  pPVar11 = local_c0.super_PromiseBase.node.ptr;
  pvVar12 = local_a8;
  if (((RVar15.super_StringPtr.content.size_ != 4) ||
      (iVar14 = bcmp(RVar15.super_StringPtr.content.ptr,"foo",3),
      pSVar7 = local_f8.super_Builder._builder.segment,
      pPVar8 = (PromiseNode *)local_f8.super_Builder._builder.capTable,
      pvVar9 = local_f8.super_Builder._builder.data,
      pSVar10 = (SegmentBuilder *)local_c0.super_PromiseBase.node.disposer,
      pPVar11 = local_c0.super_PromiseBase.node.ptr, pvVar12 = local_a8, iVar14 != 0)) &&
     (local_f8.super_Builder._builder.data = pvVar12,
     local_f8.super_Builder._builder.capTable = (CapTableBuilder *)pPVar11,
     local_f8.super_Builder._builder.segment = pSVar10, kj::_::Debug::minSeverity < 3)) {
    if (local_9c == 0) {
      local_98 = 0x7fffffff;
      local_f8.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
      local_f8.super_Builder._builder.data = (void *)0x0;
      local_f8.super_Builder._builder.segment = (SegmentBuilder *)0x0;
    }
    local_f8.super_Builder._builder.pointers._4_4_ =
         (undefined4)((ulong)local_f8.super_Builder._builder.pointers >> 0x20);
    local_f8.super_Builder._builder.pointers =
         (WirePointer *)CONCAT44(local_f8.super_Builder._builder.pointers._4_4_,local_98);
    local_48 = (ArrayPtr<const_char>)
               PointerReader::getBlob<capnp::Text>((PointerReader *)&local_f8,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[46],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x2ab,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (response.getX())\", \"foo\", response.getX()"
               ,(char (*) [46])"failed: expected (\"foo\") == (response.getX())",
               (char (*) [4])0x4fa6a4,(Reader *)&local_48);
    pSVar7 = local_f8.super_Builder._builder.segment;
    pPVar8 = (PromiseNode *)local_f8.super_Builder._builder.capTable;
    pvVar9 = local_f8.super_Builder._builder.data;
  }
  local_f8.super_Builder._builder.data = pvVar9;
  local_f8.super_Builder._builder.capTable = (CapTableBuilder *)pPVar8;
  local_f8.super_Builder._builder.segment = pSVar7;
  if ((iVar1 + 1 != *callCount) && (kj::_::Debug::minSeverity < 3)) {
    local_f8.super_Builder._builder.segment =
         (SegmentBuilder *)CONCAT44(local_f8.super_Builder._builder.segment._4_4_,iVar1 + 1);
    kj::_::Debug::log<char_const(&)[48],int,int_const&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x2ac,ERROR,
               "\"failed: expected \" \"(origCount + 1) == (callCount)\", origCount + 1, callCount",
               (char (*) [48])"failed: expected (origCount + 1) == (callCount)",(int *)&local_f8,
               callCount);
  }
  plVar5 = local_88;
  if (local_88 != (long *)0x0) {
    local_88 = (long *)0x0;
    (**(code **)*local_90)(local_90,(long)plVar5 + *(long *)(*plVar5 + -0x10));
  }
  pRVar6 = local_80.hook.ptr;
  if (local_80.hook.ptr != (RequestHook *)0x0) {
    local_80.hook.ptr = (RequestHook *)0x0;
    (**(local_80.hook.disposer)->_vptr_Disposer)
              (local_80.hook.disposer,
               pRVar6->_vptr_RequestHook[-2] + (long)&pRVar6->_vptr_RequestHook);
  }
  return;
}

Assistant:

void verifyClient(test::TestInterface::Client client, const int& callCount,
                  kj::WaitScope& waitScope) {
  int origCount = callCount;
  auto request = client.fooRequest();
  request.setI(123);
  request.setJ(true);
  auto response = request.send().wait(waitScope);
  EXPECT_EQ("foo", response.getX());
  EXPECT_EQ(origCount + 1, callCount);
}